

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest12InhibitAnyPolicy_::
Section12inhibitAnyPolicyTest3Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section12inhibitAnyPolicyTest3Subpart2
          (Section12inhibitAnyPolicyTest3Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest12InhibitAnyPolicy,
                     Section12inhibitAnyPolicyTest3Subpart2) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "inhibitAnyPolicy1CACert",
      "inhibitAnyPolicy1subCA1Cert", "inhibitAnyPolicyTest3EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "inhibitAnyPolicy1CACRL",
                              "inhibitAnyPolicy1subCA1CRL"};
  PkitsTestInfo info;
  info.test_number = "4.12.3";
  info.should_validate = false;
  info.SetInitialInhibitAnyPolicy(true);
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}